

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfdcapi_elements_transaction_CreateRawTransaction_Test::
~cfdcapi_elements_transaction_CreateRawTransaction_Test
          (cfdcapi_elements_transaction_CreateRawTransaction_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CreateRawTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  char* tx_string2 = nullptr;
  int64_t satoshi;
  uint32_t index = 0;

  ret = CfdInitializeConfidentialTx(handle, 2, 0, &tx_string);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("0200000000000000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "7461b02405414d79e79a5050684a333c922c1136f4bdff5fb94b551394edebbd", 0,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 2,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000", tx_string);

    index = 0;
    ret = CfdGetConfidentialTxInIndex(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)1, index);
  }

  if (ret == kCfdSuccess) {
    satoshi = 100000000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "ef47c42d34de1b06a02212e8061323f50d5f02ceed202f1cb375932aa299f751",
      satoshi, nullptr, "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ",
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000", tx_string);

    satoshi = 1900500000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
      satoshi, nullptr, "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM",
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000", tx_string);

    satoshi = 500000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
      satoshi, nullptr, nullptr,
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "", "76a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "", "76a914fdd725970db682de970e7669646ed7afb8348ea188ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, NULL, NULL, &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)2, index);
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000", tx_string);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxInIndex(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 3,
      &index);
    EXPECT_EQ(kCfdIllegalArgumentError, ret);
    if (ret == kCfdIllegalArgumentError) {
      ret = kCfdSuccess;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, NULL, "76a914fdd825970db682de970e7669646ed7afb8348ea188ac", &index);
    EXPECT_EQ(kCfdIllegalArgumentError, ret);
    if (ret == kCfdIllegalArgumentError) {
      ret = kCfdSuccess;
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("Failed to parameter. search target is not found.", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  if (tx_string != nullptr) {
    CfdFreeStringBuffer(tx_string);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}